

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialog::setSizeGripEnabled(QDialog *this,bool enabled)

{
  long lVar1;
  QWidgetData *pQVar2;
  QWidgetData *pQVar3;
  LayoutDirection LVar4;
  QWidget *pQVar5;
  int __sig;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QSize local_28;
  long local_20;
  
  __sig = (int)&local_28;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(bool *)(lVar1 + 0x2a0) = enabled;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    if (*(long **)(lVar1 + 0x298) != (long *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x298) + 0x20))();
      *(undefined8 *)(lVar1 + 0x298) = 0;
    }
  }
  else if ((*(char *)(lVar1 + 0x278) == '\0') && (*(long *)(lVar1 + 0x298) == 0)) {
    pQVar5 = (QWidget *)operator_new(0x28);
    QSizeGrip::QSizeGrip((QSizeGrip *)pQVar5,&this->super_QWidget);
    *(QWidget **)(lVar1 + 0x298) = pQVar5;
    local_28 = (QSize)(**(code **)(*(long *)pQVar5 + 0x70))(pQVar5);
    QWidget::resize(pQVar5,&local_28);
    LVar4 = QWidget::layoutDirection(&this->super_QWidget);
    pQVar5 = *(QWidget **)(lVar1 + 0x298);
    if (LVar4 == RightToLeft) {
      pQVar2 = (this->super_QWidget).data;
      local_28 = (QSize)((ulong)(uint)(((pQVar2->crect).y2.m_i -
                                       ((pQVar2->crect).y1.m_i + (pQVar5->data->crect).y2.m_i)) +
                                      (pQVar5->data->crect).y1.m_i) << 0x20);
    }
    else {
      pQVar2 = (this->super_QWidget).data;
      pQVar3 = pQVar5->data;
      local_28.wd.m_i =
           ((pQVar2->crect).x2.m_i - ((pQVar2->crect).x1.m_i + (pQVar3->crect).x2.m_i)) +
           (pQVar3->crect).x1.m_i;
      local_28.ht.m_i =
           ((pQVar2->crect).y2.m_i - ((pQVar2->crect).y1.m_i + (pQVar3->crect).y2.m_i)) +
           (pQVar3->crect).y1.m_i;
    }
    QWidget::move(pQVar5,(QPoint *)&local_28);
    QWidget::raise(*(QWidget **)(lVar1 + 0x298),__sig);
    QWidget::show(*(QWidget **)(lVar1 + 0x298));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QDialog);
#if QT_CONFIG(sizegrip)
    d->sizeGripEnabled = enabled;
    if (enabled && d->doShowExtension)
        return;
#endif
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            // adjustSize() processes all events, which is suboptimal
            d->resizer->resize(d->resizer->sizeHint());
            if (isRightToLeft())
                d->resizer->move(rect().bottomLeft() -d->resizer->rect().bottomLeft());
            else
                d->resizer->move(rect().bottomRight() -d->resizer->rect().bottomRight());
            d->resizer->raise();
            d->resizer->show();
        } else {
            delete d->resizer;
            d->resizer = nullptr;
        }
    }
#endif // QT_CONFIG(sizegrip)
}